

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

ScaleLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ScaleLayerParams>
          (Arena *arena)

{
  ScaleLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (ScaleLayerParams *)operator_new(0x58);
    CoreML::Specification::ScaleLayerParams::ScaleLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (ScaleLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x58,(type_info *)&CoreML::Specification::ScaleLayerParams::typeinfo);
    CoreML::Specification::ScaleLayerParams::ScaleLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }